

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::SolveSystemPhi(TPZDohrSubstruct<std::complex<float>_> *this)

{
  TPZFMatrix<std::complex<float>_> *this_00;
  ulong uVar1;
  int iVar2;
  complex<float> *pcVar3;
  complex<float> value;
  ulong row;
  ulong uVar4;
  long columns;
  TPZFMatrix<std::complex<float>_> Lambda_star;
  TPZFMatrix<std::complex<float>_> I_lambda;
  TPZFMatrix<std::complex<float>_> TStack_148;
  TPZFMatrix<std::complex<float>_> local_b8;
  
  value._M_value = (_ComplexT)&TStack_148;
  uVar1 = (this->fCoarseIndex).fNElements;
  iVar2 = (int)uVar1;
  columns = (long)iVar2;
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            (&local_b8,
             (this->fNullPivots).super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow +
             columns,columns);
  row = 0;
  memset(local_b8.fElem,0,
         local_b8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow *
         local_b8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol * 8);
  local_b8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  uVar4 = 0;
  if (0 < iVar2) {
    uVar4 = uVar1 & 0xffffffff;
  }
  for (; uVar4 != row; row = row + 1) {
    pcVar3 = TPZFMatrix<std::complex<float>_>::operator()(&local_b8,row,row);
    pcVar3->_M_value = 0x3f800000;
  }
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            (&TStack_148,
             (this->fNullPivots).super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow +
             columns,columns);
  TPZStepSolver<std::complex<float>_>::Solve
            (&this->finv,&local_b8,&TStack_148,(TPZFMatrix<std::complex<float>_> *)0x0);
  this_00 = &this->fPhiC;
  TPZFMatrix<std::complex<float>_>::Resize(this_00,(long)this->fNEquations,columns);
  TPZMatrix<std::complex<float>_>::Multiply
            (&(this->fKeC_star).super_TPZMatrix<std::complex<float>_>,&TStack_148,this_00,0);
  TPZFMatrix<std::complex<float>_>::operator*=(this_00,value);
  ComputeCoarseStiffness(this);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&TStack_148);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_b8);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::SolveSystemPhi() {
	int ncoarse = fCoarseIndex.NElements();
	int i;
	//  I_star.Print("fIStar = ",out,EMathematicaInput);
	//  std::cout << "Nci: ";
	//  std::cout << ncoarse;// << endl;
	//  std::cout << endl;
	//Constructing I_lambda
	TPZFMatrix<TVar> I_lambda(ncoarse+fNullPivots.Rows(),ncoarse);
	I_lambda.Zero();
	for (i=0;i<ncoarse;i++) {
		I_lambda(i,i)=1;
	}
	//  I_lambda.Print("ILambda = ",out,EMathematicaInput);
	
	//Obtaining lambda_star
	TPZFMatrix<TVar> Lambda_star(ncoarse+fNullPivots.Rows(),ncoarse);
	//  temp1->Print("temp1 = ",out,EMathematicaInput);
	//  out.flush();
	finv.Solve(I_lambda, Lambda_star);
	
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		Lambda_star.Print("matrix lambda star",sout );
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//Obtaining Phi
	/** Acho q posso comentar essas duas linhas abaixo, pq naum tou vendo aplicacao pra temp2 */
	/*
	 TPZFMatrix<TVar> temp2(fNEquations,ncoarse);
	 C_star.MultAdd(Lambda_star,Lambda_star,temp2,-1,0,1,1);
	 */
	fPhiC.Resize(fNEquations,ncoarse);
	fKeC_star.Multiply(Lambda_star,fPhiC);
	fPhiC *= -1.;
	ComputeCoarseStiffness();
	//  fPhiC.Print("PhiC = ",out,EMathematicaInput);
	//  fC.Print("Ci = ",std::cout,EMathematicaInput);
}